

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O0

void __thiscall ClipperLib::clipperException::~clipperException(clipperException *this)

{
  clipperException *this_local;
  
  ~clipperException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~clipperException() throw() {}